

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

void Perform_Justification(FIELD *field,WINDOW_conflict *win)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  
  pcVar3 = Get_Start_Of_Data(field->buf,field->dcols * field->drows);
  pcVar4 = After_End_Of_Data(field->buf,field->dcols * field->drows);
  iVar5 = (int)pcVar4 - (int)pcVar3;
  if (iVar5 < 1) {
    return;
  }
  if (((win != (WINDOW_conflict *)0x0) && (field->drows == 1)) &&
     (iVar1 = field->dcols, iVar1 == field->cols)) {
    if (field->just == 3) {
      iVar2 = iVar1 - iVar5;
    }
    else {
      iVar2 = 0;
      if (field->just == 2) {
        iVar2 = (iVar1 - iVar5) / 2;
      }
    }
    wmove(win,0,iVar2);
    waddnstr(win,pcVar3,iVar5);
    return;
  }
  __assert_fail("win && (field->drows == 1) && (field->dcols == field->cols)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x2f2,"void Perform_Justification(FIELD *, WINDOW *)");
}

Assistant:

static void Perform_Justification(FIELD  * field, WINDOW * win)
{
  char *bp;
  int len;
  int col  = 0;

  bp  = Get_Start_Of_Data(field->buf,Buffer_Length(field));
  len = (int)(After_End_Of_Data(field->buf,Buffer_Length(field)) - bp);

  if (len>0)
    {
      assert(win && (field->drows == 1) && (field->dcols == field->cols));

      switch(field->just)
        {
        case JUSTIFY_LEFT:
          break;
        case JUSTIFY_CENTER:
          col = (field->cols - len)/2;
          break;
        case JUSTIFY_RIGHT:
          col = field->cols - len;
          break;
        default:
          break;
        }

      wmove(win,0,col);
      waddnstr(win,bp,len);
    }
}